

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void Cmd_atexit(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  GameAtExit *pGVar5;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Registered atexit commands:\n");
    for (pGVar5 = ExitCmdList; pGVar5 != (GameAtExit *)0x0; pGVar5 = pGVar5->Next) {
      Printf("%s\n",pGVar5->Command);
    }
  }
  else {
    iVar1 = FCommandLine::argc(argv);
    if (1 < iVar1) {
      iVar1 = 1;
      do {
        pcVar3 = FCommandLine::operator[](argv,iVar1);
        sVar4 = strlen(pcVar3);
        pGVar5 = (GameAtExit *)
                 M_Malloc_Dbg(sVar4 + 0x10,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_console.cpp"
                              ,0x184);
        pcVar3 = FCommandLine::operator[](argv,iVar1);
        strcpy(pGVar5->Command,pcVar3);
        pGVar5->Next = ExitCmdList;
        iVar1 = iVar1 + 1;
        ExitCmdList = pGVar5;
        iVar2 = FCommandLine::argc(argv);
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

CCMD (atexit)
{
	if (argv.argc() == 1)
	{
		Printf ("Registered atexit commands:\n");
		GameAtExit *record = ExitCmdList;
		while (record != NULL)
		{
			Printf ("%s\n", record->Command);
			record = record->Next;
		}
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		GameAtExit *record = (GameAtExit *)M_Malloc (
			sizeof(GameAtExit)+strlen(argv[i]));
		strcpy (record->Command, argv[i]);
		record->Next = ExitCmdList;
		ExitCmdList = record;
	}
}